

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::UsingDeclaration::UsingDeclaration
          (UsingDeclaration *this,Context *c,Identifier usingName,
          pool_ptr<soul::AST::Expression> *target)

{
  SourceCodeText *pSVar1;
  Expression *pEVar2;
  Scope *pSVar3;
  
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.objectType =
       UsingDeclaration;
  pSVar1 = (c->location).sourceCode.object;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.context.
  location.sourceCode.object = pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pSVar3 = c->parentScope;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.context.
  location.location.data = (c->location).location.data;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.context.
  parentScope = pSVar3;
  (this->super_TypeDeclarationBase).super_Expression.kind = type;
  (this->super_TypeDeclarationBase).name.name = usingName.name;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject
       = (_func_int **)&PTR__UsingDeclaration_002f70f8;
  pEVar2 = target->object;
  (this->targetType).object = pEVar2;
  if (((pEVar2 != (Expression *)0x0) && (pEVar2->kind != type)) && (pEVar2->kind != unknown)) {
    throwInternalCompilerError
              ("targetType == nullptr || isPossiblyType (targetType)","UsingDeclaration",0x5ad);
  }
  return;
}

Assistant:

UsingDeclaration (const Context& c, Identifier usingName, pool_ptr<Expression> target)
            : TypeDeclarationBase (ObjectType::UsingDeclaration, c, usingName), targetType (target)
        {
            SOUL_ASSERT (targetType == nullptr || isPossiblyType (targetType));
        }